

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5SentenceFinderCb
              (void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Fts5SFinder *p;
  int iAdd;
  
  if ((tflags & 1U) != 0) {
    return 0;
  }
  iAdd = *pContext;
  if (iAdd < 1) {
    iAdd = 0;
  }
  else {
    iVar3 = 0;
    if (iStartOff < 1) goto LAB_001d6fc3;
    uVar4 = (ulong)(iStartOff - 1U);
    do {
      bVar1 = *(byte *)(*(long *)((long)pContext + 0x18) + uVar4);
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_001d6fa8;
      bVar2 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    uVar4 = 0xffffffff;
LAB_001d6fa8:
    iVar3 = 0;
    if (((uint)uVar4 == iStartOff - 1U) || ((bVar1 != 0x3a && (bVar1 != 0x2e)))) goto LAB_001d6fc3;
  }
  iVar3 = fts5SentenceFinderAdd((Fts5SFinder *)pContext,iAdd);
LAB_001d6fc3:
  *(int *)pContext = *pContext + 1;
  return iVar3;
}

Assistant:

static int fts5SentenceFinderCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start offset of token */
  int iEndOff                     /* End offset of token */
){
  int rc = SQLITE_OK;

  UNUSED_PARAM2(pToken, nToken);
  UNUSED_PARAM(iEndOff);

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ){
    Fts5SFinder *p = (Fts5SFinder*)pContext;
    if( p->iPos>0 ){
      int i;
      char c = 0;
      for(i=iStartOff-1; i>=0; i--){
        c = p->zDoc[i];
        if( c!=' ' && c!='\t' && c!='\n' && c!='\r' ) break;
      }
      if( i!=iStartOff-1 && (c=='.' || c==':') ){
        rc = fts5SentenceFinderAdd(p, p->iPos);
      }
    }else{
      rc = fts5SentenceFinderAdd(p, 0);
    }
    p->iPos++;
  }
  return rc;
}